

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<wchar_t> * __thiscall asl::Array<wchar_t>::operator=(Array<wchar_t> *this,Array<wchar_t> *b)

{
  wchar_t *pwVar1;
  
  if (this->_a != b->_a) {
    LOCK();
    pwVar1 = this->_a + -2;
    *pwVar1 = *pwVar1 + L'\xffffffff';
    UNLOCK();
    if (*pwVar1 == L'\0') {
      free(this,b);
    }
    pwVar1 = b->_a;
    this->_a = pwVar1;
    LOCK();
    pwVar1 = pwVar1 + -2;
    *pwVar1 = *pwVar1 + L'\x01';
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}